

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmListFileContext * __thiscall cmListFileBacktrace::Top(cmListFileBacktrace *this)

{
  int iVar1;
  cmListFileBacktrace *this_local;
  
  if (this->Cur == (Entry *)0x0) {
    if (Top()::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&Top()::empty);
      if (iVar1 != 0) {
        cmListFileContext::cmListFileContext(&Top::empty);
        __cxa_atexit(cmListFileContext::~cmListFileContext,&Top::empty,&__dso_handle);
        __cxa_guard_release(&Top()::empty);
      }
    }
    this_local = (cmListFileBacktrace *)&Top::empty;
  }
  else {
    this_local = (cmListFileBacktrace *)this->Cur;
  }
  return (cmListFileContext *)this_local;
}

Assistant:

cmListFileContext const& cmListFileBacktrace::Top() const
{
  if (this->Cur) {
    return *this->Cur;
  }
  static cmListFileContext const empty;
  return empty;
}